

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

int __thiscall
google::protobuf::compiler::CodeGeneratorRequest::ByteSize(CodeGeneratorRequest *this)

{
  string *psVar1;
  void *pvVar2;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  
  iVar4 = 0;
  if ((this->_has_bits_[0] & 2) != 0) {
    psVar1 = this->parameter_;
    uVar6 = (uint)psVar1->_M_string_length;
    iVar4 = 2;
    if (0x7f < uVar6) {
      iVar4 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
      iVar4 = iVar4 + 1;
    }
    iVar4 = iVar4 + (int)psVar1->_M_string_length;
  }
  iVar5 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
  iVar4 = iVar4 + iVar5;
  if (0 < iVar5) {
    lVar7 = 0;
    do {
      pvVar2 = (this->file_to_generate_).super_RepeatedPtrFieldBase.elements_[lVar7];
      uVar6 = *(uint *)((long)pvVar2 + 8);
      iVar5 = 1;
      if (0x7f < uVar6) {
        iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
      }
      iVar4 = iVar4 + iVar5 + *(int *)((long)pvVar2 + 8);
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar5 = (this->proto_file_).super_RepeatedPtrFieldBase.current_size_;
  iVar4 = iVar4 + iVar5;
  if (0 < iVar5) {
    lVar7 = 0;
    do {
      uVar6 = FileDescriptorProto::ByteSize
                        ((FileDescriptorProto *)
                         (this->proto_file_).super_RepeatedPtrFieldBase.elements_[lVar7]);
      iVar5 = 1;
      if (0x7f < uVar6) {
        iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
      }
      iVar4 = iVar4 + uVar6 + iVar5;
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->proto_file_).super_RepeatedPtrFieldBase.current_size_);
  }
  pvVar3 = (this->_unknown_fields_).fields_;
  if ((pvVar3 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar5 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar4 = iVar4 + iVar5;
  }
  this->_cached_size_ = iVar4;
  return iVar4;
}

Assistant:

int CodeGeneratorRequest::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[1 / 32] & (0xffu << (1 % 32))) {
    // optional string parameter = 2;
    if (has_parameter()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->parameter());
    }

  }
  // repeated string file_to_generate = 1;
  total_size += 1 * this->file_to_generate_size();
  for (int i = 0; i < this->file_to_generate_size(); i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->file_to_generate(i));
  }

  // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
  total_size += 1 * this->proto_file_size();
  for (int i = 0; i < this->proto_file_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->proto_file(i));
  }

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}